

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_util.c
# Opt level: O0

void dump_hex(uint8_t *data,size_t len)

{
  size_t sVar1;
  ulong local_48;
  size_t i;
  uint8_t *pascii;
  uint8_t ascii [32];
  size_t len_local;
  uint8_t *data_local;
  
  ascii._24_8_ = len;
  memset(&pascii,0,0x20);
  i = (size_t)&pascii;
  if (ascii._24_8_ != 0) {
    for (local_48 = 0; local_48 < (ulong)ascii._24_8_; local_48 = local_48 + 1) {
      if ((local_48 & 0xf) == 0) {
        if (local_48 != 0) {
          *(undefined1 *)i = 0;
          printf("%s",&pascii);
        }
        printf("\n\t%03zu: ",local_48);
        i = (size_t)&pascii;
      }
      printf("%02x, ",(ulong)data[local_48]);
      if ((data[local_48] < 0x20) || (0x7e < data[local_48])) {
        *(undefined1 *)i = 0x2e;
      }
      else {
        *(uint8_t *)i = data[local_48];
      }
      i = i + 1;
    }
    *(undefined1 *)i = 0;
    sVar1 = strnlen((char *)&pascii,0x20);
    if (sVar1 != 0) {
      for (local_48 = 0; sVar1 = strnlen((char *)&pascii,0x20), local_48 < 0x10 - sVar1;
          local_48 = local_48 + 1) {
        printf("    ");
      }
      printf("%s",&pascii);
    }
  }
  printf("\n");
  return;
}

Assistant:

void dump_hex(const uint8_t *data, size_t len) {
    uint8_t  ascii[32] = { 0 };
    uint8_t *pascii    = ascii;

    if (len > 0) {
        size_t i;

        for (i = 0; i < len; i++) {
            if (i % 16 == 0) {
                if (i > 0) {
                    *pascii++ = '\0';
                    printf("%s", ascii);
                }
                printf("\n\t%03zu: ", i);
                pascii = ascii;
            }
            printf("%02x, ", data[i]);

            if ((data[i] >= 0x20) && (data[i] < 0x7F)) {
                *pascii++ = data[i];
            } else {
                *pascii++ = '.';
            }
        }
        *pascii++ = '\0';

        if (strnlen((char *)ascii, sizeof(ascii)) > 0) {
            for (i = 0; i < 16 - strnlen((char *)ascii, sizeof(ascii)); i++) {
                printf("    ");
            }
            printf("%s", ascii);
        }
    }
    printf("\n");
}